

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_until.hpp
# Opt level: O0

void __thiscall
asio::detail::
read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>,asio::detail::is_continuation_if_running>>
::read_until_delim_string_op<asio::basic_streambuf_ref<std::allocator<char>>>
          (read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>_>
           *this,basic_stream_socket<asio::ip::tcp> *stream,
          basic_streambuf_ref<std::allocator<char>_> *buffers,string *delim,
          wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
          *handler)

{
  string *in_RCX;
  basic_streambuf_ref<std::allocator<char>_> *in_RDX;
  strand_service *in_RSI;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
  *in_RDI;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
  *other;
  
  (in_RDI->dispatcher_).service_ = in_RSI;
  basic_streambuf_ref<std::allocator<char>_>::basic_streambuf_ref
            ((basic_streambuf_ref<std::allocator<char>_> *)&(in_RDI->dispatcher_).impl_,in_RDX);
  other = (wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
           *)&in_RDI->handler_;
  std::__cxx11::string::string((string *)other,in_RCX);
  *(undefined4 *)
   ((long)&(in_RDI->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
           .
           super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
           .super__Head_base<1UL,_std::function<void_(const_std::error_code_&)>,_false>._M_head_impl
           .super__Function_base + 0x10) = 0;
  (in_RDI->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .
  super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<1UL,_std::function<void_(const_std::error_code_&)>,_false>._M_head_impl.
  _M_invoker = (_Invoker_type)0x0;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
  ::wrapped_handler(in_RDI,other);
  return;
}

Assistant:

read_until_delim_string_op(AsyncReadStream& stream,
        ASIO_MOVE_ARG(BufferSequence) buffers,
        const std::string& delim, ReadHandler& handler)
      : stream_(stream),
        buffers_(ASIO_MOVE_CAST(BufferSequence)(buffers)),
        delim_(delim),
        start_(0),
        search_position_(0),
        handler_(ASIO_MOVE_CAST(ReadHandler)(handler))
    {
    }